

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetUpperBound(LoopDependenceAnalysis *this,Loop *loop)

{
  Instruction *instruction;
  Instruction *inst;
  SENode *pSVar1;
  SENode *pSVar2;
  uint uVar3;
  ScalarEvolutionAnalysis *this_00;
  
  instruction = Loop::GetConditionInst(loop);
  if (instruction != (Instruction *)0x0) {
    inst = GetOperandDefinition(this,instruction,1);
    uVar3 = instruction->opcode_ - OpUGreaterThan;
    if (uVar3 < 8) {
      if ((0xccU >> (uVar3 & 0x1f) & 1) == 0) {
        this_00 = &this->scalar_evolution_;
        if ((3U >> (uVar3 & 0x1f) & 1) == 0) {
          pSVar1 = ScalarEvolutionAnalysis::AnalyzeInstruction(this_00,inst);
          pSVar2 = ScalarEvolutionAnalysis::CreateConstant(this_00,1);
          pSVar1 = ScalarEvolutionAnalysis::CreateSubtraction(this_00,pSVar1,pSVar2);
        }
        else {
          pSVar1 = ScalarEvolutionAnalysis::AnalyzeInstruction(this_00,inst);
          pSVar2 = ScalarEvolutionAnalysis::CreateConstant(this_00,1);
          pSVar1 = ScalarEvolutionAnalysis::CreateAddNode(this_00,pSVar1,pSVar2);
        }
      }
      else {
        pSVar1 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,inst);
      }
      pSVar1 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar1);
      return pSVar1;
    }
  }
  return (SENode *)0x0;
}

Assistant:

SENode* LoopDependenceAnalysis::GetUpperBound(const Loop* loop) {
  Instruction* cond_inst = loop->GetConditionInst();
  if (!cond_inst) {
    return nullptr;
  }
  Instruction* upper_inst = GetOperandDefinition(cond_inst, 1);
  switch (cond_inst->opcode()) {
    case spv::Op::OpULessThan:
    case spv::Op::OpSLessThan: {
      // When we have a < condition we must subtract 1 from the analyzed upper
      // instruction.
      SENode* upper_bound = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.CreateSubtraction(
              scalar_evolution_.AnalyzeInstruction(upper_inst),
              scalar_evolution_.CreateConstant(1)));
      return upper_bound;
    }
    case spv::Op::OpUGreaterThan:
    case spv::Op::OpSGreaterThan: {
      // When we have a > condition we must add 1 to the analyzed upper
      // instruction.
      SENode* upper_bound =
          scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateAddNode(
              scalar_evolution_.AnalyzeInstruction(upper_inst),
              scalar_evolution_.CreateConstant(1)));
      return upper_bound;
    }
    case spv::Op::OpULessThanEqual:
    case spv::Op::OpSLessThanEqual:
    case spv::Op::OpUGreaterThanEqual:
    case spv::Op::OpSGreaterThanEqual: {
      // We don't need to modify the results of analyzing when we have <= or >=.
      SENode* upper_bound = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(upper_inst));
      return upper_bound;
    }
    default:
      return nullptr;
  }
}